

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

t_symbol * stlook(int flag)

{
  bool bVar1;
  int iVar2;
  uint hash;
  t_symbol *ptVar3;
  
  if ((symbol[1] == '@') || (symbol[1] == '.')) {
    if (glablptr == (t_symbol *)0x0) {
      error("Local symbol not allowed here!");
      return (t_symbol *)0x0;
    }
    ptVar3 = (t_symbol *)&glablptr->local;
    do {
      ptVar3 = ptVar3->next;
      if (ptVar3 == (t_symbol *)0x0) break;
      iVar2 = strcmp(symbol,ptVar3->name);
    } while (iVar2 != 0);
    bVar1 = true;
    if (flag == 0 || ptVar3 != (t_symbol *)0x0) goto LAB_00112834;
    hash = 0;
    iVar2 = 1;
  }
  else {
    hash = symhash();
    ptVar3 = (t_symbol *)(hash_tbl + hash);
    do {
      ptVar3 = ptVar3->next;
      if (ptVar3 == (t_symbol *)0x0) break;
      iVar2 = strcmp(symbol,ptVar3->name);
    } while (iVar2 != 0);
    bVar1 = true;
    if ((flag == 0) || (ptVar3 != (t_symbol *)0x0)) goto LAB_00112834;
    iVar2 = 0;
  }
  bVar1 = false;
  ptVar3 = stinstall(hash,iVar2);
LAB_00112834:
  if ((bVar1) && (ptVar3 != (t_symbol *)0x0)) {
    ptVar3->refcnt = ptVar3->refcnt + 1;
  }
  return ptVar3;
}

Assistant:

struct t_symbol *stlook(int flag)
{
	struct t_symbol *sym;
	int sym_flag = 0;
	int hash;

	/* local symbol */
	if (symbol[1] == '.' || symbol[1] == '@') {
		if (glablptr) {
			/* search the symbol in the local list */
			sym = glablptr->local;

			while (sym) {
				if (!strcmp(symbol, sym->name))
					break;
				sym = sym->next;
			}

			/* new symbol */
			if (sym == NULL) {
				if (flag) {
					sym = stinstall(0, 1);
					sym_flag = 1;
				}
			}
		}
		else {
			error("Local symbol not allowed here!");
			return (NULL);
		}
	}

	/* global symbol */
	else {
		/* search symbol */
		hash = symhash();
		sym  = hash_tbl[hash];
		while (sym) {
			if (!strcmp(symbol, sym->name))
				break;
			sym = sym->next;
		}

		/* new symbol */
		if (sym == NULL) {
			if (flag) {
				sym = stinstall(hash, 0);
				sym_flag = 1;
			}
		}
	}

	/* incremente symbol reference counter */
	if (sym_flag == 0) {
		if (sym)
			sym->refcnt++;
	}

	/* ok */
	return (sym);
}